

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

int evsig_del(event_base *base,int evsignal,short old,short events,void *p)

{
  int *piVar1;
  int iVar2;
  undefined6 in_register_0000000a;
  void *pvVar3;
  
  if ((uint)evsignal < 0x41) {
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("%s: %d: restoring signal handler","evsig_del",(ulong)(uint)evsignal,
                    CONCAT62(in_register_0000000a,events));
    }
    if (evsig_base_lock == (void *)0x0) {
      pvVar3 = (void *)0x0;
    }
    else {
      (*evthread_lock_fns_.lock)(0,evsig_base_lock);
      pvVar3 = evsig_base_lock;
    }
    evsig_base_n_signals_added = evsig_base_n_signals_added + -1;
    piVar1 = &(base->sig).ev_n_signals_added;
    *piVar1 = *piVar1 + -1;
    if (pvVar3 != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,pvVar3);
    }
    iVar2 = evsig_restore_handler_(base,evsignal);
    return iVar2;
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/signal.c"
             ,0x16d,"evsignal >= 0 && evsignal < NSIG","evsig_del");
}

Assistant:

static int
evsig_del(struct event_base *base, evutil_socket_t evsignal, short old, short events, void *p)
{
	EVUTIL_ASSERT(evsignal >= 0 && evsignal < NSIG);

	event_debug(("%s: "EV_SOCK_FMT": restoring signal handler",
		__func__, EV_SOCK_ARG(evsignal)));

	EVSIGBASE_LOCK();
	--evsig_base_n_signals_added;
	--base->sig.ev_n_signals_added;
	EVSIGBASE_UNLOCK();

	return (evsig_restore_handler_(base, (int)evsignal));
}